

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcContain.c
# Opt level: O0

void Mvc_CoverRemoveContained(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *local_70;
  bool local_61;
  Mvc_Cube_t *local_60;
  Mvc_List_t *pList;
  uint local_48;
  int _i_;
  int Result;
  uint sizeCur;
  Mvc_Cube_t *pPrev;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pCubeLarge;
  Mvc_Cube_t *pCubeEnd;
  Mvc_Cube_t *pCubeBeg;
  Mvc_Cover_t *pCover_local;
  
  pCubeEnd = Mvc_CoverReadCubeHead(pCover);
  do {
    pCubeLarge = pCubeEnd;
    for (pCube2 = pCubeEnd->pNext;
        (pCube2 != (Mvc_Cube_t *)0x0 && (pCubeEnd->nOnes == pCube2->nOnes)); pCube2 = pCube2->pNext)
    {
      pCubeLarge = pCube2;
    }
    if (pCube2 == (Mvc_Cube_t *)0x0) {
      return;
    }
    for (pCube = pCubeEnd; pCube != (Mvc_Cube_t *)0x0; pCube = pCube->pNext) {
      _Result = pCubeLarge;
      pCube2 = pCubeLarge->pNext;
      if (pCube2 == (Mvc_Cube_t *)0x0) {
        local_60 = (Mvc_Cube_t *)0x0;
      }
      else {
        local_60 = pCube2->pNext;
      }
      pPrev = local_60;
      while (pCube2 != (Mvc_Cube_t *)0x0) {
        if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 0) {
          local_48 = pCube2->pData[0] & (pCube->pData[0] ^ 0xffffffff);
        }
        else if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 1) {
          local_61 = true;
          if ((pCube2->pData[0] & (pCube->pData[0] ^ 0xffffffff)) == 0) {
            local_61 = (*(uint *)&pCube2->field_0x14 & (*(uint *)&pCube->field_0x14 ^ 0xffffffff))
                       != 0;
          }
          local_48 = (uint)local_61;
        }
        else {
          local_48 = 0;
          for (pList._4_4_ = *(uint *)&pCube2->field_0x8 & 0xffffff; -1 < (int)pList._4_4_;
              pList._4_4_ = pList._4_4_ - 1) {
            if ((pCube2->pData[(int)pList._4_4_] & (pCube->pData[(int)pList._4_4_] ^ 0xffffffff)) !=
                0) {
              local_48 = 1;
              break;
            }
          }
        }
        if (local_48 == 0) {
          if (_Result == (Mvc_Cube_t *)0x0) {
            (pCover->lCubes).pHead = pCube2->pNext;
          }
          else {
            _Result->pNext = pCube2->pNext;
          }
          if ((pCover->lCubes).pTail == pCube2) {
            if (pCube2->pNext != (Mvc_Cube_t *)0x0) {
              __assert_fail("pCube->pNext == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcContain.c"
                            ,0x97,"void Mvc_CoverRemoveContained(Mvc_Cover_t *)");
            }
            (pCover->lCubes).pTail = _Result;
          }
          (pCover->lCubes).nItems = (pCover->lCubes).nItems + -1;
          Mvc_CubeFree(pCover,pCube2);
        }
        else {
          _Result = pCube2;
        }
        pCube2 = pPrev;
        if (pPrev == (Mvc_Cube_t *)0x0) {
          local_70 = (Mvc_Cube_t *)0x0;
        }
        else {
          local_70 = pPrev->pNext;
        }
        pPrev = local_70;
      }
      if (pCube == pCubeLarge) break;
    }
    pCubeEnd = pCubeLarge->pNext;
    if (pCubeEnd == (Mvc_Cube_t *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Mvc_CoverRemoveContained( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeBeg, * pCubeEnd, * pCubeLarge;
    Mvc_Cube_t * pCube, * pCube2, * pPrev;
    unsigned sizeCur;
    int  Result;

    // since the cubes are sorted by size, it is sufficient 
    // to compare each cube with other cubes that have larger sizes
    // if the given cube implies a larger cube, the larger cube is removed
    pCubeBeg = Mvc_CoverReadCubeHead(pCover);
    do
    {
        // get the current cube size
        sizeCur = Mvc_CubeReadSize(pCubeBeg);

        // initialize the end of the given size group
        pCubeEnd = pCubeBeg;
        // find the beginning of the next size group
        Mvc_CoverForEachCubeStart( Mvc_CubeReadNext(pCubeBeg), pCube )
        {
            if ( sizeCur == Mvc_CubeReadSize(pCube) ) 
                pCubeEnd = pCube;
            else // pCube is the first cube in the new size group
                break;
        }
        // if we could not find the next size group
        // the containment check is finished
        if ( pCube == NULL )
            break;
        // otherwise, pCubeBeg/pCubeEnd are the first/last cubes of the group

        // go through all the cubes between pCubeBeg and pCubeEnd, inclusive,
        // and for each of them, try removing cubes after pCubeEnd
        Mvc_CoverForEachCubeStart( pCubeBeg, pCubeLarge )
        {
            pPrev = pCubeEnd;
            Mvc_CoverForEachCubeStartSafe( Mvc_CubeReadNext(pCubeEnd), pCube, pCube2 )
            {
                // check containment
                Mvc_CubeBitNotImpl( Result, pCube, pCubeLarge );
                if ( !Result )
                { // pCubeLarge implies pCube - remove pCube
                    Mvc_CoverDeleteCube( pCover, pPrev, pCube );
                    Mvc_CubeFree( pCover, pCube );
                    // don't update the previous cube
                }
                else
                {   // update the previous cube
                    pPrev = pCube;
                }
            }
            // quit, if the main cube was the last one of this size
            if ( pCubeLarge == pCubeEnd )
                break;
        }

        // set the beginning of the next group
        pCubeBeg = Mvc_CubeReadNext(pCubeEnd);
    }
    while ( pCubeBeg );
}